

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

void __thiscall SQLexer::LexBlockComment(SQLexer *this)

{
  LexChar LVar1;
  bool bVar2;
  bool done;
  SQLexer *this_local;
  
  bVar2 = false;
LAB_00132548:
  do {
    while( true ) {
      if (bVar2) {
        return;
      }
      LVar1 = this->_currdata;
      if (LVar1 != '\0') break;
      Error(this,"missing \"*/\" in comment");
LAB_001325fa:
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
    }
    if (LVar1 == '\n') {
      this->_currentline = this->_currentline + 1;
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      goto LAB_00132548;
    }
    if (LVar1 != '*') goto LAB_001325fa;
    Next(this);
    this->_currentcolumn = this->_currentcolumn + 1;
    if (this->_currdata == '/') {
      bVar2 = true;
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
    }
  } while( true );
}

Assistant:

void SQLexer::LexBlockComment()
{
    bool done = false;
    while(!done) {
        switch(CUR_CHAR) {
            case _SC('*'): { NEXT(); if(CUR_CHAR == _SC('/')) { done = true; NEXT(); }}; continue;
            case _SC('\n'): _currentline++; NEXT(); continue;
            case SQUIRREL_EOB: Error(_SC("missing \"*/\" in comment"));
            default: NEXT();
        }
    }
}